

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_row_access_constructors<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>,std::vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>>>>>>
               (vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
                *matrix,vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>_>_>
                        *rows)

{
  _Rb_tree_header *p_Var1;
  pointer psVar2;
  key_type *pkVar3;
  Index IVar4;
  pointer psVar5;
  Index IVar6;
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*>,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*>_>
  *p_Var7;
  ulong uVar8;
  bool bVar9;
  long lVar10;
  _Rb_tree_node_base *p_Var11;
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
  *r_1;
  pointer psVar12;
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
  *r;
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
  *p_Var13;
  pair<std::_Rb_tree_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::_Rb_tree_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
  pVar14;
  undefined4 local_2e4;
  undefined *local_2e0;
  undefined4 *local_2d8;
  undefined **local_2d0;
  undefined **local_2c8;
  ulong local_2c0;
  shared_count sStack_2b8;
  undefined4 **local_2b0;
  char *local_2a8;
  char *local_2a0;
  shared_count sStack_298;
  undefined **local_290;
  undefined1 local_288;
  undefined8 *local_280;
  undefined ***local_278;
  undefined4 **local_270;
  char *local_268;
  undefined **local_260;
  char *local_258;
  shared_count sStack_250;
  char *local_248;
  vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>_>_>
  *local_240;
  vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
  *local_238;
  undefined1 local_230 [24];
  undefined4 ***local_218;
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*>,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*>_>
  local_210;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined1 local_1d0 [16];
  pointer pvStack_1c0;
  Index local_1b8;
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*>,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*>_>
  local_1b0;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_rows<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>>
            ();
  get_ordered_rows<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_230,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)local_1d0,
             (vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_230);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)local_230);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_1d0);
  build_column_values<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>>
            ();
  get_ordered_column_contents<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_230,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)local_1d0,
             (vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_230);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)local_230);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_1d0);
  local_238 = matrix;
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>
  ::
  Set_column<std::vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>>>>>>
            ((Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>
              *)local_1d0,
             (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,6,rows,(Column_settings *)0x0);
  psVar2 = (rows->
           super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_240 = rows;
  IVar4 = local_1d0._0_4_;
  psVar5 = (pointer)local_1d0._8_8_;
  IVar6 = local_1b8;
  local_210._M_impl.super__Rb_tree_header._M_header._M_color =
       local_1b0._M_impl.super__Rb_tree_header._M_header._M_color;
  local_210._M_impl.super__Rb_tree_header._M_header._M_parent =
       local_1b0._M_impl.super__Rb_tree_header._M_header._M_parent;
  for (psVar12 = (rows->
                 super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; local_1d0._8_8_ = psVar5,
      psVar12 != psVar2; psVar12 = psVar12 + 1) {
    local_1d0._0_4_ = IVar4;
    local_1b8 = IVar6;
    local_1b0._M_impl.super__Rb_tree_header._M_header._M_color =
         local_210._M_impl.super__Rb_tree_header._M_header._M_color;
    local_1b0._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_210._M_impl.super__Rb_tree_header._M_header._M_parent;
    if ((psVar12->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
      lVar10 = std::_Rb_tree_decrement(&(psVar12->_M_t)._M_impl.super__Rb_tree_header._M_header);
      if ((*(uint *)(lVar10 + 0x24) < 6) && ((0x2bU >> (*(uint *)(lVar10 + 0x24) & 0x1f) & 1) != 0))
      {
        local_120 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_118 = "";
        local_130 = &boost::unit_test::basic_cstring<char_const>::null;
        local_128 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x215);
        local_2c0 = local_2c0 & 0xffffffffffffff00;
        local_2c8 = &PTR__lazy_ostream_001dc440;
        sStack_2b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_2b0 = (undefined4 **)0x1a81a4;
        local_2d8 = (undefined4 *)CONCAT44(local_2d8._4_4_,*(int *)(lVar10 + 0x20));
        local_2e0 = (undefined *)CONCAT44(local_2e0._4_4_,6);
        local_260 = (undefined **)CONCAT71(local_260._1_7_,*(int *)(lVar10 + 0x20) == 6);
        local_258 = (char *)0x0;
        sStack_250.pi_ = (sp_counted_base *)0x0;
        local_2a8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_2a0 = "";
        local_270 = &local_2d8;
        local_230._8_8_ = local_230._8_8_ & 0xffffffffffffff00;
        local_230._0_8_ = &PTR__lazy_ostream_001dc900;
        local_230._16_8_ = &boost::unit_test::lazy_ostream::inst;
        local_218 = &local_270;
        local_2d0 = &local_2e0;
        local_288 = 0;
        local_290 = &PTR__lazy_ostream_001dc940;
        local_280 = &boost::unit_test::lazy_ostream::inst;
        local_278 = &local_2d0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_260,&local_2c8,&local_2a8,0x215,1,2,2,"entry.get_column_index()",local_230
                   ,"6",&local_290);
        boost::detail::shared_count::~shared_count(&sStack_250);
      }
    }
    IVar4 = local_1d0._0_4_;
    psVar5 = (pointer)local_1d0._8_8_;
    IVar6 = local_1b8;
    local_210._M_impl.super__Rb_tree_header._M_header._M_color =
         local_1b0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_210._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_1b0._M_impl.super__Rb_tree_header._M_header._M_parent;
  }
  p_Var1 = &local_1b0._M_impl.super__Rb_tree_header;
  local_1d0._0_4_ = 0;
  local_210._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_210._M_impl.super__Rb_tree_header._M_header;
  local_230._4_4_ = (undefined4)((ulong)local_230._0_8_ >> 0x20);
  local_230._0_4_ = IVar4;
  pvStack_1c0 = (pointer)0xffffffffffffffff;
  local_1b8 = 0xffffffff;
  uVar8 = (ulong)local_218 >> 0x20;
  local_218 = (undefined4 ***)CONCAT44((int)uVar8,IVar6);
  if (local_210._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    p_Var7 = &local_210;
    local_210._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_210._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_210._M_impl.super__Rb_tree_header._M_header._M_right =
         local_210._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    p_Var7 = &local_1b0;
    (local_210._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         local_210._M_impl.super__Rb_tree_header._M_header._M_left;
    local_210._M_impl.super__Rb_tree_header._M_header._M_left =
         local_1b0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_210._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1b0._M_impl.super__Rb_tree_header._M_header._M_right;
    local_210._M_impl.super__Rb_tree_header._M_node_count =
         local_1b0._M_impl.super__Rb_tree_header._M_node_count;
    local_1b0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_1b0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  local_1b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (p_Var7->_M_impl).super__Rb_tree_header._M_node_count = 0;
  local_1e0 = (undefined4)local_180;
  local_180._4_4_ = (undefined4)((ulong)local_180 >> 0x20);
  uStack_1dc = local_180._4_4_;
  uStack_1d8 = (undefined4)uStack_178;
  uStack_178._4_4_ = (undefined4)((ulong)uStack_178 >> 0x20);
  uStack_1d4 = uStack_178._4_4_;
  local_180 = (Field_operators *)0x0;
  uStack_178 = (Entry_constructor *)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230._8_8_ = psVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x21c);
  local_258 = (char *)((ulong)local_258 & 0xffffffffffffff00);
  local_260 = &PTR__lazy_ostream_001dc440;
  sStack_250.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_2d0 = &local_2e0;
  local_2e0 = (undefined *)local_210._M_impl.super__Rb_tree_header._M_node_count;
  local_2d8 = &local_2e4;
  local_2e4 = 4;
  local_2a0 = (char *)0x0;
  sStack_298.pi_ = (sp_counted_base *)0x0;
  local_270 = (undefined4 **)0x1a88bd;
  local_268 = "";
  local_278 = &local_2d0;
  local_288 = 0;
  local_290 = &PTR__lazy_ostream_001dc400;
  local_280 = &boost::unit_test::lazy_ostream::inst;
  local_2b0 = &local_2d8;
  local_2c0 = local_2c0 & 0xffffffffffffff00;
  local_2c8 = &PTR__lazy_ostream_001dc940;
  sStack_2b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2a8._0_1_ =
       (undefined *)local_210._M_impl.super__Rb_tree_header._M_node_count == (undefined *)0x4;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_298);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x21d);
  local_258 = (char *)((ulong)local_258 & 0xffffffffffffff00);
  local_260 = &PTR__lazy_ostream_001dc440;
  sStack_250.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_2e0 = (undefined *)local_1b0._M_impl.super__Rb_tree_header._M_node_count;
  local_2a8 = (char *)CONCAT71(local_2a8._1_7_,
                               (undefined *)local_1b0._M_impl.super__Rb_tree_header._M_node_count ==
                               (undefined *)0x0);
  local_2e4 = 0;
  local_2a0 = (char *)0x0;
  sStack_298.pi_ = (sp_counted_base *)0x0;
  local_270 = (undefined4 **)0x1a88bd;
  local_268 = "";
  local_2d0 = &local_2e0;
  local_288 = 0;
  local_290 = &PTR__lazy_ostream_001dc400;
  local_280 = &boost::unit_test::lazy_ostream::inst;
  local_278 = &local_2d0;
  local_2d8 = &local_2e4;
  local_2c0 = local_2c0 & 0xffffffffffffff00;
  local_2c8 = &PTR__lazy_ostream_001dc940;
  sStack_2b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2b0 = &local_2d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_2a8,&local_260,&local_270,0x21d,1,2,2,"col.size()",&local_290,"0",&local_2c8);
  boost::detail::shared_count::~shared_count(&sStack_298);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x21e);
  bVar9 = Gudhi::persistence_matrix::operator==
                    ((local_238->
                     super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
                      *)local_230);
  local_2c8 = (undefined **)CONCAT71(local_2c8._1_7_,bVar9);
  local_2c0 = 0;
  sStack_2b8.pi_ = (sp_counted_base *)0x0;
  local_260 = (undefined **)0x1b2a1c;
  local_258 = "";
  local_288 = 0;
  local_290 = &PTR__lazy_ostream_001dc3b0;
  local_280 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_278 = &local_260;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2b8);
  psVar2 = (local_240->
           super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (psVar12 = (local_240->
                 super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; psVar12 != psVar2;
      psVar12 = psVar12 + 1) {
    if ((psVar12->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
      lVar10 = std::_Rb_tree_decrement(&(psVar12->_M_t)._M_impl.super__Rb_tree_header._M_header);
      if ((*(uint *)(lVar10 + 0x24) < 6) && ((0x2bU >> (*(uint *)(lVar10 + 0x24) & 0x1f) & 1) != 0))
      {
        local_140 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_138 = "";
        local_150 = &boost::unit_test::basic_cstring<char_const>::null;
        local_148 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x22d,
                   &local_150);
        local_258 = (char *)((ulong)local_258 & 0xffffffffffffff00);
        local_260 = &PTR__lazy_ostream_001dc440;
        sStack_250.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_248 = "";
        local_2e0 = (undefined *)CONCAT44(local_2e0._4_4_,*(int *)(lVar10 + 0x20));
        local_2e4 = 6;
        local_2a8 = (char *)CONCAT71(local_2a8._1_7_,*(int *)(lVar10 + 0x20) == 6);
        local_2a0 = (char *)0x0;
        sStack_298.pi_ = (sp_counted_base *)0x0;
        local_270 = (undefined4 **)0x1a88bd;
        local_268 = "";
        local_2d0 = &local_2e0;
        local_288 = 0;
        local_290 = &PTR__lazy_ostream_001dc900;
        local_280 = &boost::unit_test::lazy_ostream::inst;
        local_278 = &local_2d0;
        local_2d8 = &local_2e4;
        local_2c0 = local_2c0 & 0xffffffffffffff00;
        local_2c8 = &PTR__lazy_ostream_001dc940;
        sStack_2b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_2b0 = &local_2d8;
        boost::test_tools::tt_detail::report_assertion
                  (&local_2a8,&local_260,&local_270,0x22d,1,2,2,"entry.get_column_index()",
                   &local_290,"6",&local_2c8);
        boost::detail::shared_count::~shared_count(&sStack_298);
      }
    }
  }
  Gudhi::persistence_matrix::swap
            ((Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
              *)local_1d0,
             (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
              *)local_230);
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x234);
  local_258 = (char *)((ulong)local_258 & 0xffffffffffffff00);
  local_260 = &PTR__lazy_ostream_001dc440;
  sStack_250.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_2e0 = (undefined *)local_210._M_impl.super__Rb_tree_header._M_node_count;
  local_2e4 = 0;
  local_2a0 = (char *)0x0;
  sStack_298.pi_ = (sp_counted_base *)0x0;
  local_270 = (undefined4 **)0x1a88bd;
  local_268 = "";
  local_2d0 = &local_2e0;
  local_288 = 0;
  local_290 = &PTR__lazy_ostream_001dc400;
  local_280 = &boost::unit_test::lazy_ostream::inst;
  local_278 = &local_2d0;
  local_2d8 = &local_2e4;
  local_2c0 = local_2c0 & 0xffffffffffffff00;
  local_2c8 = &PTR__lazy_ostream_001dc940;
  sStack_2b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2b0 = &local_2d8;
  local_2a8._0_1_ =
       (undefined *)local_210._M_impl.super__Rb_tree_header._M_node_count == (undefined *)0x0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_298);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x235);
  local_258 = (char *)((ulong)local_258 & 0xffffffffffffff00);
  local_260 = &PTR__lazy_ostream_001dc440;
  sStack_250.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_2e0 = (undefined *)local_1b0._M_impl.super__Rb_tree_header._M_node_count;
  local_2a8 = (char *)CONCAT71(local_2a8._1_7_,
                               (undefined *)local_1b0._M_impl.super__Rb_tree_header._M_node_count ==
                               (undefined *)0x4);
  local_2e4 = 4;
  local_2a0 = (char *)0x0;
  sStack_298.pi_ = (sp_counted_base *)0x0;
  local_270 = (undefined4 **)0x1a88bd;
  local_268 = "";
  local_2d0 = &local_2e0;
  local_288 = 0;
  local_290 = &PTR__lazy_ostream_001dc400;
  local_280 = &boost::unit_test::lazy_ostream::inst;
  local_278 = &local_2d0;
  local_2d8 = &local_2e4;
  local_2c0 = local_2c0 & 0xffffffffffffff00;
  local_2c8 = &PTR__lazy_ostream_001dc940;
  sStack_2b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2b0 = &local_2d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_2a8,&local_260,&local_270,0x235,1,2,2,"col.size()",&local_290,"4",&local_2c8);
  boost::detail::shared_count::~shared_count(&sStack_298);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x236);
  bVar9 = Gudhi::persistence_matrix::operator==
                    ((local_238->
                     super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
                      *)local_1d0);
  local_2c8 = (undefined **)CONCAT71(local_2c8._1_7_,bVar9);
  local_2c0 = 0;
  sStack_2b8.pi_ = (sp_counted_base *)0x0;
  local_260 = (undefined **)0x1b2a31;
  local_258 = "";
  local_288 = 0;
  local_290 = &PTR__lazy_ostream_001dc3b0;
  local_280 = &boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_278 = &local_260;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2b8);
  psVar2 = (local_240->
           super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (psVar12 = (local_240->
                 super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; psVar12 != psVar2;
      psVar12 = psVar12 + 1) {
    if ((psVar12->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
      lVar10 = std::_Rb_tree_decrement(&(psVar12->_M_t)._M_impl.super__Rb_tree_header._M_header);
      if ((*(uint *)(lVar10 + 0x24) < 6) && ((0x2bU >> (*(uint *)(lVar10 + 0x24) & 0x1f) & 1) != 0))
      {
        local_160 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_158 = "";
        local_170 = &boost::unit_test::basic_cstring<char_const>::null;
        local_168 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x245,
                   &local_170);
        local_258 = (char *)((ulong)local_258 & 0xffffffffffffff00);
        local_260 = &PTR__lazy_ostream_001dc440;
        sStack_250.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_248 = "";
        local_2e0 = (undefined *)CONCAT44(local_2e0._4_4_,*(int *)(lVar10 + 0x20));
        local_2e4 = 6;
        local_2a8 = (char *)CONCAT71(local_2a8._1_7_,*(int *)(lVar10 + 0x20) == 6);
        local_2a0 = (char *)0x0;
        sStack_298.pi_ = (sp_counted_base *)0x0;
        local_270 = (undefined4 **)0x1a88bd;
        local_268 = "";
        local_2d0 = &local_2e0;
        local_288 = 0;
        local_290 = &PTR__lazy_ostream_001dc900;
        local_280 = &boost::unit_test::lazy_ostream::inst;
        local_278 = &local_2d0;
        local_2d8 = &local_2e4;
        local_2c0 = local_2c0 & 0xffffffffffffff00;
        local_2c8 = &PTR__lazy_ostream_001dc940;
        sStack_2b8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_2b0 = &local_2d8;
        boost::test_tools::tt_detail::report_assertion
                  (&local_2a8,&local_260,&local_270,0x245,1,2,2,"entry.get_column_index()",
                   &local_290,"6",&local_2c8);
        boost::detail::shared_count::~shared_count(&sStack_298);
      }
    }
  }
  for (p_Var11 = local_210._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var11 != &local_210._M_impl.super__Rb_tree_header;
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
    pkVar3 = *(key_type **)(p_Var11 + 1);
    if ((pointer)local_230._8_8_ != (pointer)0x0) {
      p_Var13 = (_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
                 *)((ulong)pkVar3->rowIndex_ * 0x30 +
                   *(long *)&(((pointer)local_230._8_8_)->_M_t)._M_impl);
      pVar14 = std::
               _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
               ::equal_range(p_Var13,pkVar3);
      std::
      _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
      ::_M_erase_aux(p_Var13,(_Base_ptr)pVar14.first._M_node,(_Base_ptr)pVar14.second._M_node);
    }
    operator_delete(pkVar3,8);
  }
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*>,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*>_>
  ::~_Rb_tree(&local_210);
  for (p_Var11 = local_1b0._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var11 != &local_1b0._M_impl.super__Rb_tree_header;
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
    pkVar3 = *(key_type **)(p_Var11 + 1);
    if ((pointer)local_1d0._8_8_ != (pointer)0x0) {
      p_Var13 = (_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
                 *)((ulong)pkVar3->rowIndex_ * 0x30 +
                   *(long *)&(((pointer)local_1d0._8_8_)->_M_t)._M_impl);
      pVar14 = std::
               _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
               ::equal_range(p_Var13,pkVar3);
      std::
      _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>_>
      ::_M_erase_aux(p_Var13,(_Base_ptr)pVar14.first._M_node,(_Base_ptr)pVar14.second._M_node);
    }
    operator_delete(pkVar3,8);
  }
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*>,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*>_>
  ::~_Rb_tree(&local_1b0);
  return;
}

Assistant:

void column_test_row_access_constructors(std::vector<Column>& matrix, Row_container& rows) {
  test_matrix_equality<Column>(build_rows<Column>(), get_ordered_rows(matrix));
  test_matrix_equality<Column>(build_column_values<Column>(), get_ordered_column_contents(matrix));

  Column col(matrix[0], 6, &rows);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  Column moveCol(std::move(col));
  BOOST_CHECK_EQUAL(moveCol.size(), 4);
  BOOST_CHECK_EQUAL(col.size(), 0);
  BOOST_CHECK(matrix[0] == moveCol);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  swap(col, moveCol);
  BOOST_CHECK_EQUAL(moveCol.size(), 0);
  BOOST_CHECK_EQUAL(col.size(), 4);
  BOOST_CHECK(matrix[0] == col);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }
}